

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O0

void I_InitMusic(void)

{
  int iVar1;
  bool local_9;
  
  Timidity::LoadConfig();
  FBaseCVar::Callback(&snd_musicvolume.super_FBaseCVar);
  iVar1 = DArgs::CheckParm(Args,"-nomusic",1);
  local_9 = true;
  if (iVar1 == 0) {
    iVar1 = DArgs::CheckParm(Args,"-nosound",1);
    local_9 = iVar1 != 0;
  }
  nomusic = (int)local_9;
  if ((I_InitMusic::setatterm & 1U) == 0) {
    I_InitMusic::setatterm = true;
    addterm(I_ShutdownMusicExit,"I_ShutdownMusicExit");
    signal(0x11,ChildSigHandler);
  }
  MusicDown = false;
  return;
}

Assistant:

void I_InitMusic (void)
{
	static bool setatterm = false;

	Timidity::LoadConfig();

	snd_musicvolume.Callback ();

	nomusic = !!Args->CheckParm("-nomusic") || !!Args->CheckParm("-nosound");

#ifdef _WIN32
	I_InitMusicWin32 ();
#endif // _WIN32
	
	if (!setatterm)
	{
		setatterm = true;
		atterm (I_ShutdownMusicExit);
	
#ifndef _WIN32
		signal (SIGCHLD, ChildSigHandler);
#endif
	}
	MusicDown = false;
}